

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

string * iconv_convert_abi_cxx11_(string *__return_storage_ptr__,char *src,size_t len,iconv_t conv)

{
  string *psVar1;
  size_t sVar2;
  int *piVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  char *bufptr;
  size_t outlen;
  char buffer [512];
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  string *local_260;
  char *local_258;
  size_t local_250;
  size_t local_248;
  char *local_240;
  char local_238 [520];
  
  local_280._M_p = (pointer)&local_270;
  local_278 = 0;
  local_270._M_local_buf[0] = '\0';
  local_260 = __return_storage_ptr__;
  local_248 = len;
  local_240 = src;
  do {
    local_250 = 0x200;
    local_258 = local_238;
    sVar2 = iconv(conv,&local_240,&local_248,&local_258,&local_250);
    std::__cxx11::string::replace((ulong)&local_280,local_278,(char *)0x0,(ulong)local_238);
    if (sVar2 != 0xffffffffffffffff) {
      (local_260->_M_dataplus)._M_p = (pointer)&local_260->field_2;
      paVar4 = &local_270;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_p == paVar4) {
        (local_260->field_2)._M_allocated_capacity =
             CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
        *(undefined8 *)((long)&local_260->field_2 + 8) = local_270._8_8_;
      }
      else {
        (local_260->_M_dataplus)._M_p = local_280._M_p;
        (local_260->field_2)._M_allocated_capacity =
             CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
      }
      psVar5 = &local_278;
      local_260->_M_string_length = local_278;
      local_280._M_p = (pointer)paVar4;
      goto LAB_0010a877;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 7);
  perror("Failed string encoding conversion:");
  paVar4 = &local_260->field_2;
  (local_260->_M_dataplus)._M_p = (pointer)paVar4;
  psVar5 = &local_260->_M_string_length;
LAB_0010a877:
  psVar1 = local_260;
  *psVar5 = 0;
  paVar4->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != &local_270) {
    operator_delete(local_280._M_p,
                    CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]) + 1);
  }
  return psVar1;
}

Assistant:

static std::string iconv_convert(const char* src, size_t len, iconv_t conv) {
	std::string out;
	char buffer[512];
	size_t res;
	do {
		char* bufptr = buffer;
		size_t outlen = sizeof(buffer);
		res = iconv(conv, const_cast<char**>(&src), &len, &bufptr, &outlen);
		out.append(buffer, bufptr);
	} while (res == (size_t)-1 && errno == E2BIG);
	if (res == -1) {
		perror("Failed string encoding conversion:");
		return std::string();
	}
	return out;
}